

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O1

int run_test_tcp_connect_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_connect_t *loop;
  uv_loop_t *loop_00;
  int iVar2;
  char *pcVar3;
  uv_timer_t *puVar4;
  sockaddr_in addr;
  sockaddr_in local_20;
  
  pcVar3 = "8.8.8.8";
  iVar2 = 9999;
  iVar1 = uv_ip4_addr("8.8.8.8",9999,&local_20);
  if (iVar1 == 0) {
    loop = (uv_connect_t *)uv_default_loop();
    iVar2 = 0x336c48;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&timer);
    if (iVar1 != 0) goto LAB_0016f9c7;
    puVar4 = &timer;
    iVar2 = 0x16f9e5;
    iVar1 = uv_timer_start(&timer,timer_cb,0x32,0);
    loop = (uv_connect_t *)puVar4;
    if (iVar1 != 0) goto LAB_0016f9cc;
    loop = (uv_connect_t *)uv_default_loop();
    iVar2 = 0x336ce0;
    iVar1 = uv_tcp_init((uv_loop_t *)loop,&conn);
    if (iVar1 != 0) goto LAB_0016f9d1;
    loop = &connect_req;
    iVar2 = 0x336ce0;
    iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&local_20,connect_cb);
    if (iVar1 != 0) {
      if (iVar1 == -0x65) {
        run_test_tcp_connect_timeout_cold_7();
        return 1;
      }
      goto LAB_0016f9d6;
    }
    loop = (uv_connect_t *)uv_default_loop();
    iVar2 = 0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      iVar2 = 0;
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = (uv_connect_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016f9e0;
    }
  }
  else {
    run_test_tcp_connect_timeout_cold_1();
    loop = (uv_connect_t *)pcVar3;
LAB_0016f9c7:
    run_test_tcp_connect_timeout_cold_2();
LAB_0016f9cc:
    run_test_tcp_connect_timeout_cold_3();
LAB_0016f9d1:
    run_test_tcp_connect_timeout_cold_4();
LAB_0016f9d6:
    run_test_tcp_connect_timeout_cold_8();
  }
  run_test_tcp_connect_timeout_cold_5();
LAB_0016f9e0:
  run_test_tcp_connect_timeout_cold_6();
  if ((uv_timer_t *)loop == &timer) {
    uv_close((uv_handle_t *)&conn,close_cb);
    uv_close((uv_handle_t *)&timer,close_cb);
    return extraout_EAX;
  }
  timer_cb_cold_1();
  if (loop == &connect_req) {
    if (iVar2 == -0x7d) {
      connect_cb_called = connect_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  if ((uv_timer_t *)loop != &timer && (uv_tcp_t *)loop != &conn) {
    close_cb_cold_1();
    iVar1 = uv_is_closing((uv_handle_t *)loop);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      return extraout_EAX_01;
    }
    return iVar1;
  }
  close_cb_called = close_cb_called + 1;
  return (int)CONCAT71(0x336c,(uv_tcp_t *)loop == &conn);
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}